

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void write_velocity(char *fn,qnode_ptr_t p)

{
  int __fd;
  int bytes;
  int fdf;
  int j;
  int i;
  float y;
  float x;
  qnode_ptr_t p_local;
  char *fn_local;
  
  _y = p;
  p_local = (qnode_ptr_t)fn;
  __fd = creat(fn,0x180);
  if (__fd < 1) {
    error(6);
  }
  i = (int)(float)_y->sizx;
  j = (int)(float)_y->sizy;
  write(__fd,&i,4);
  write(__fd,&j,4);
  i = (int)(float)((_y->sizx + KERNEL_X * -2 + -0x12) / 1);
  j = (int)(float)((_y->sizy + KERNEL_Y * -2 + -0x12) / 1);
  write(__fd,&i,4);
  write(__fd,&j,4);
  i = (int)(float)((KERNEL_X + 9) / 1);
  j = (int)(float)((KERNEL_Y + 9) / 1);
  write(__fd,&i,4);
  write(__fd,&j,4);
  for (fdf = KERNEL_Y + 9; fdf < (_y->sizy - KERNEL_Y) + -9; fdf = fdf + 1) {
    for (bytes = KERNEL_X + 9; bytes < (_y->sizx - KERNEL_X) + -9; bytes = bytes + 1) {
      i = (int)(*_y->flow_ptr)[_y->res * fdf + bytes].y;
      j = (int)-(*_y->flow_ptr)[_y->res * fdf + bytes].x;
      write(__fd,&i,4);
      write(__fd,&j,4);
    }
  }
  close(__fd);
  return;
}

Assistant:

void write_velocity(fn,p)
qnode_ptr_t p ;
char *fn ;

{ extern int KERNEL_X, KERNEL_Y ;
  float x, y ;
  int i, j, fdf, bytes ;

  if ((fdf=creat(fn,0600)) < 1) {
    error(6) ;
  }

  x = p->sizx ;
  y = p->sizy ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;

  x = ((p->sizx-KERNEL_X-NRADIUS)-(KERNEL_X+NRADIUS)+SKIP-1)/SKIP ;
  y = ((p->sizy-KERNEL_Y-NRADIUS)-(KERNEL_Y+NRADIUS)+SKIP-1)/SKIP ;
  write(fdf,&x,4);
  write(fdf,&y,4);

  x = (KERNEL_X+NRADIUS+SKIP-1)/SKIP ;
  y = (KERNEL_Y+NRADIUS+SKIP-1)/SKIP ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;
  bytes = 24 ;

  for(i = KERNEL_Y + NRADIUS ; i < p->sizy - KERNEL_Y - NRADIUS ; i++) {
    for(j = KERNEL_X + NRADIUS ; j < p->sizx - KERNEL_X - NRADIUS ; j++) {
      x = (*p->flow_ptr)[p->res*i + j].y ;
      y = -(*p->flow_ptr)[p->res*i + j].x ;
      write(fdf,&x,4) ;
      write(fdf,&y,4) ;
      bytes += 8 ;
    }
  }
  close(fdf) ;
}